

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5SegIterSetNext(Fts5Index *p,Fts5SegIter *pIter)

{
  code *pcVar1;
  
  if ((pIter->flags & 2) == 0) {
    if (p->pConfig->eDetail == 1) {
      pcVar1 = fts5SegIterNext_None;
    }
    else {
      pcVar1 = fts5SegIterNext;
    }
  }
  else {
    pcVar1 = fts5SegIterNext_Reverse;
  }
  pIter->xNext = pcVar1;
  return;
}

Assistant:

static void fts5SegIterSetNext(Fts5Index *p, Fts5SegIter *pIter){
  if( pIter->flags & FTS5_SEGITER_REVERSE ){
    pIter->xNext = fts5SegIterNext_Reverse;
  }else if( p->pConfig->eDetail==FTS5_DETAIL_NONE ){
    pIter->xNext = fts5SegIterNext_None;
  }else{
    pIter->xNext = fts5SegIterNext;
  }
}